

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_transaction.cpp
# Opt level: O2

void __thiscall
duckdb::CatalogTransaction::CatalogTransaction
          (CatalogTransaction *this,Catalog *catalog,ClientContext *context)

{
  int iVar1;
  Transaction *pTVar2;
  DatabaseInstance *pDVar3;
  DuckTransaction *dtransaction;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  this->db = (DatabaseInstance *)0x0;
  this->context = (ClientContext *)0x0;
  (this->transaction).ptr = (Transaction *)0x0;
  pTVar2 = Transaction::Get(context,catalog);
  pDVar3 = DatabaseInstance::GetDatabase(context);
  (this->db).ptr = pDVar3;
  iVar1 = (*pTVar2->_vptr_Transaction[3])(pTVar2);
  auVar4._8_4_ = 0xffffffff;
  auVar4._0_8_ = 0xffffffffffffffff;
  auVar4._12_4_ = 0xffffffff;
  if ((char)iVar1 != '\0') {
    auVar4._0_8_ = pTVar2[1]._vptr_Transaction;
    auVar4._8_8_ = pTVar2[1].manager;
  }
  auVar5._0_8_ = auVar4._8_8_;
  auVar5._8_4_ = auVar4._0_4_;
  auVar5._12_4_ = auVar4._4_4_;
  this->transaction_id = auVar5._0_8_;
  this->start_time = auVar5._8_8_;
  (this->transaction).ptr = pTVar2;
  (this->context).ptr = context;
  return;
}

Assistant:

CatalogTransaction::CatalogTransaction(Catalog &catalog, ClientContext &context) {
	auto &transaction = Transaction::Get(context, catalog);
	this->db = &DatabaseInstance::GetDatabase(context);
	if (!transaction.IsDuckTransaction()) {
		this->transaction_id = transaction_t(-1);
		this->start_time = transaction_t(-1);
	} else {
		auto &dtransaction = transaction.Cast<DuckTransaction>();
		this->transaction_id = dtransaction.transaction_id;
		this->start_time = dtransaction.start_time;
	}
	this->transaction = &transaction;
	this->context = &context;
}